

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

Range<float,_2> __thiscall Nova::Grid<float,_2>::Cell_Domain(Grid<float,_2> *this,T_INDEX *index)

{
  Vector<int,_2,_true> *in_RDX;
  TV extraout_XMM0_Qa;
  T_STORAGE in_XMM1_Qa;
  Range<float,_2> RVar1;
  Vector<float,_2,_true> local_40;
  Vector<float,_2,_true> local_38;
  Vector<float,_2,_true> local_30;
  Vector<float,_2,_true> local_28;
  TV corner;
  T_INDEX *index_local;
  Grid<float,_2> *this_local;
  
  Vector<float,_2,_true>::Vector<int>(&local_38,in_RDX);
  Vector<float,_2,_true>::operator*(&local_30,&local_38);
  Vector<float,_2,_true>::operator+(&local_28,(Vector<float,_2,_true> *)(index + 1));
  Vector<float,_2,_true>::operator-(&local_40,&local_28);
  Range<float,_2>::Range((Range<float,_2> *)this,&local_40,&local_28);
  RVar1.max_corner._data._M_elems = (T_STORAGE)(T_STORAGE)in_XMM1_Qa._M_elems;
  RVar1.min_corner._data._M_elems = extraout_XMM0_Qa._data._M_elems;
  return RVar1;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }